

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O1

StackBackTrace *
StackBackTrace::Capture<Memory::Recycler>(Recycler *alloc,ULONG framesToSkip,ULONG framesToCapture)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this;
  undefined4 *puVar4;
  StackBackTrace *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_274d470;
  data.filename._0_4_ = 0x2f;
  data.typeinfo = (type_info *)((ulong)framesToCapture * 8);
  this = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_58);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00aa1db0;
    *puVar4 = 0;
  }
  this_00 = (StackBackTrace *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (this,(size_t)((type_info *)((ulong)framesToCapture * 8) + 8));
  if (this_00 == (StackBackTrace *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00aa1db0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  StackBackTrace(this_00,framesToSkip,framesToCapture);
  return this_00;
}

Assistant:

StackBackTrace *
StackBackTrace::Capture(TAllocator * alloc, ULONG framesToSkip, ULONG framesToCapture)
{
    return AllocatorNewPlusZ(TAllocator, alloc, sizeof(PVOID) * framesToCapture, StackBackTrace, framesToSkip, framesToCapture);
}